

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aabb.h
# Opt level: O1

bool __thiscall AABB::Hit(AABB *this,Ray *ray,double tmin,double tmax)

{
  double dVar1;
  double dVar2;
  ulong uVar3;
  bool bVar4;
  double dVar5;
  double local_38 [4];
  double local_18 [3];
  
  uVar3 = 0;
  bVar4 = false;
  while( true ) {
    local_18[2] = (ray->a_).e[2];
    local_18[0] = (ray->a_).e[0];
    local_18[1] = (ray->a_).e[1];
    local_38[2] = (ray->b_).e[2];
    local_38[0] = (ray->b_).e[0];
    local_38[1] = (ray->b_).e[1];
    dVar5 = ((this->min_).e[uVar3] - local_18[uVar3]) / local_38[uVar3];
    local_18[2] = (ray->a_).e[2];
    local_18[0] = (ray->a_).e[0];
    local_18[1] = (ray->a_).e[1];
    local_38[2] = (ray->b_).e[2];
    local_38[0] = (ray->b_).e[0];
    local_38[1] = (ray->b_).e[1];
    dVar1 = ((this->max_).e[uVar3] - local_18[uVar3]) / local_38[uVar3];
    dVar2 = dVar1;
    if (dVar5 <= dVar1) {
      dVar2 = dVar5;
    }
    if (tmin <= dVar2) {
      tmin = dVar2;
    }
    if (dVar5 <= dVar1) {
      dVar5 = dVar1;
    }
    if (dVar5 <= tmax) {
      tmax = dVar5;
    }
    if (tmax < tmin) break;
    bVar4 = 1 < uVar3;
    uVar3 = uVar3 + 1;
    if (uVar3 == 3) {
      return bVar4;
    }
  }
  return bVar4;
}

Assistant:

bool Hit(const Ray& ray, double tmin, double tmax) const {
    for (int i = 0; i < 3; i++) {
      double t0 = (min_[i] - ray.origin()[i]) / ray.direction()[i];
      double t1 = (max_[i] - ray.origin()[i]) / ray.direction()[i];
      if (t0 > t1) std::swap(t0, t1);
      tmin = t0 < tmin ? tmin : t0;
      tmax = t1 > tmax ? tmax : t1;
      if (tmax < tmin) return false;
    }
    return true;
  }